

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::BufferIoExecutor::computeVarLayout
               (vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                *symbols,
               vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
               *layout)

{
  bool bVar1;
  DataType DVar2;
  deUint32 dVar3;
  int iVar4;
  int vecSize;
  deUint32 dVar5;
  size_type __new_size;
  Symbol *pSVar6;
  const_reference pvVar7;
  reference pvVar8;
  pointer pVVar9;
  __normal_iterator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout_*,_std::vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>_>
  local_68;
  __normal_iterator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout_*,_std::vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>_>
  local_60;
  iterator varIter;
  deUint32 totalSize;
  deUint32 vecAlignment;
  DataType vecType;
  int numVecs;
  deUint32 size;
  deUint32 alignment;
  VarLayout *layoutEntry;
  DataType basicType;
  Symbol *symbol;
  size_t varNdx;
  deUint32 curOffset;
  deUint32 maxAlignment;
  vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
  *layout_local;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols_local;
  
  varNdx._4_4_ = 0;
  varNdx._0_4_ = 0;
  __new_size = std::
               vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ::size(symbols);
  std::
  vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
  ::resize(layout,__new_size);
  for (symbol = (Symbol *)0x0;
      pSVar6 = (Symbol *)
               std::
               vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ::size(symbols), symbol < pSVar6; symbol = (Symbol *)&(symbol->name).field_0x1) {
    pvVar7 = std::
             vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ::operator[](symbols,(size_type)symbol);
    DVar2 = glu::VarType::getBasicType(&pvVar7->varType);
    pvVar8 = std::
             vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
             ::operator[](layout,(size_type)symbol);
    bVar1 = glu::isDataTypeScalarOrVector(DVar2);
    if (bVar1) {
      dVar5 = getVecStd430ByteAlignment(DVar2);
      iVar4 = glu::getDataTypeScalarSize(DVar2);
      dVar3 = deAlign32((int)varNdx,dVar5);
      varNdx._4_4_ = de::max<unsigned_int>(varNdx._4_4_,dVar5);
      pvVar8->offset = dVar3;
      pvVar8->matrixStride = 0;
      varNdx._0_4_ = iVar4 * 4 + dVar3;
    }
    else {
      bVar1 = glu::isDataTypeMatrix(DVar2);
      if (bVar1) {
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar2);
        vecSize = glu::getDataTypeMatrixNumRows(DVar2);
        DVar2 = glu::getDataTypeFloatVec(vecSize);
        varIter._M_current._4_4_ = getVecStd430ByteAlignment(DVar2);
        dVar5 = deAlign32((int)varNdx,varIter._M_current._4_4_);
        varNdx._4_4_ = de::max<unsigned_int>(varNdx._4_4_,varIter._M_current._4_4_);
        pvVar8->offset = dVar5;
        pvVar8->matrixStride = varIter._M_current._4_4_;
        varNdx._0_4_ = varIter._M_current._4_4_ * iVar4 + dVar5;
      }
    }
  }
  varIter._M_current._0_4_ = deAlign32((int)varNdx,varNdx._4_4_);
  local_60._M_current =
       (VarLayout *)
       std::
       vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
       ::begin(layout);
  while( true ) {
    local_68._M_current =
         (VarLayout *)
         std::
         vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
         ::end(layout);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
    dVar5 = (deUint32)varIter._M_current;
    if (!bVar1) break;
    pVVar9 = __gnu_cxx::
             __normal_iterator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout_*,_std::vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>_>
             ::operator->(&local_60);
    pVVar9->stride = dVar5;
    __gnu_cxx::
    __normal_iterator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout_*,_std::vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>_>
    ::operator++(&local_60);
  }
  return;
}

Assistant:

void BufferIoExecutor::computeVarLayout (const std::vector<Symbol>& symbols, std::vector<VarLayout>* layout)
{
	deUint32	maxAlignment	= 0;
	deUint32	curOffset		= 0;

	DE_ASSERT(layout->empty());
	layout->resize(symbols.size());

	for (size_t varNdx = 0; varNdx < symbols.size(); varNdx++)
	{
		const Symbol&		symbol		= symbols[varNdx];
		const glu::DataType	basicType	= symbol.varType.getBasicType();
		VarLayout&			layoutEntry	= (*layout)[varNdx];

		if (glu::isDataTypeScalarOrVector(basicType))
		{
			const deUint32	alignment	= getVecStd430ByteAlignment(basicType);
			const deUint32	size		= (deUint32)glu::getDataTypeScalarSize(basicType)*(int)sizeof(deUint32);

			curOffset		= (deUint32)deAlign32((int)curOffset, (int)alignment);
			maxAlignment	= de::max(maxAlignment, alignment);

			layoutEntry.offset			= curOffset;
			layoutEntry.matrixStride	= 0;

			curOffset += size;
		}
		else if (glu::isDataTypeMatrix(basicType))
		{
			const int				numVecs			= glu::getDataTypeMatrixNumColumns(basicType);
			const glu::DataType		vecType			= glu::getDataTypeFloatVec(glu::getDataTypeMatrixNumRows(basicType));
			const deUint32			vecAlignment	= getVecStd430ByteAlignment(vecType);

			curOffset		= (deUint32)deAlign32((int)curOffset, (int)vecAlignment);
			maxAlignment	= de::max(maxAlignment, vecAlignment);

			layoutEntry.offset			= curOffset;
			layoutEntry.matrixStride	= vecAlignment;

			curOffset += vecAlignment*numVecs;
		}
		else
			DE_ASSERT(false);
	}

	{
		const deUint32	totalSize	= (deUint32)deAlign32(curOffset, maxAlignment);

		for (vector<VarLayout>::iterator varIter = layout->begin(); varIter != layout->end(); ++varIter)
			varIter->stride = totalSize;
	}
}